

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerUComp
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  BinaryOp op_00;
  BinaryOp op_01;
  Builder *pBVar1;
  Builder *pBVar2;
  Index IVar3;
  LocalGet *pLVar4;
  LocalGet *pLVar5;
  Binary *pBVar6;
  Binary *pBVar7;
  Binary *right;
  Block *pBVar8;
  uint uVar9;
  
  uVar9 = op - LtUInt64;
  if ((uVar9 < 7) && ((0x55U >> (uVar9 & 0x1f) & 1) != 0)) {
    op_00 = *(BinaryOp *)(&DAT_00e0620c + (ulong)uVar9 * 4);
    op_01 = *(BinaryOp *)(&DAT_00e06228 + (ulong)uVar9 * 4);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,(Type)0x2);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    pLVar5 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    pBVar6 = Builder::makeBinary(pBVar1,op_01,(Expression *)pLVar4,(Expression *)pLVar5);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,(Type)0x2);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    pLVar5 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    pBVar7 = Builder::makeBinary(pBVar1,EqInt32,(Expression *)pLVar4,(Expression *)pLVar5);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftLow);
    pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,(Type)0x2);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightLow);
    pLVar5 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    right = Builder::makeBinary(pBVar1,op_00,(Expression *)pLVar4,(Expression *)pLVar5);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pBVar7 = Builder::makeBinary(pBVar1,AndInt32,(Expression *)pBVar7,(Expression *)right);
    pBVar6 = Builder::makeBinary(pBVar1,OrInt32,(Expression *)pBVar6,(Expression *)pBVar7);
    pBVar8 = Builder::blockify(pBVar1,(Expression *)result,(Expression *)pBVar6);
    return pBVar8;
  }
  abort();
}

Assistant:

Block* lowerUComp(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    BinaryOp highOp, lowOp;
    switch (op) {
      case LtUInt64:
        highOp = LtUInt32;
        lowOp = LtUInt32;
        break;
      case LeUInt64:
        highOp = LtUInt32;
        lowOp = LeUInt32;
        break;
      case GtUInt64:
        highOp = GtUInt32;
        lowOp = GtUInt32;
        break;
      case GeUInt64:
        highOp = GtUInt32;
        lowOp = GeUInt32;
        break;
      default:
        abort();
    }
    Binary* compHigh =
      builder->makeBinary(highOp,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* eqHigh =
      builder->makeBinary(EqInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* compLow =
      builder->makeBinary(lowOp,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32));
    return builder->blockify(
      result,
      builder->makeBinary(
        OrInt32, compHigh, builder->makeBinary(AndInt32, eqHigh, compLow)));
  }